

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

void Omega_h::any::vtable_dynamic<Omega_h::NameValue>::destroy(storage_union *storage)

{
  NameValue *this;
  storage_union *storage_local;
  
  this = (NameValue *)storage->dynamic;
  if (this != (NameValue *)0x0) {
    NameValue::~NameValue(this);
    operator_delete(this,0x30);
  }
  return;
}

Assistant:

static void destroy(storage_union& storage) noexcept {
      // assert(reinterpret_cast<T*>(storage.dynamic));
      delete reinterpret_cast<T*>(storage.dynamic);
    }